

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

char * nng_http_get_uri(nng_http *conn)

{
  char *pcVar1;
  
  pcVar1 = nni_http_get_uri(conn);
  return pcVar1;
}

Assistant:

const char *
nng_http_get_uri(nng_http *conn)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_get_uri(conn));
#else
	NNI_ARG_UNUSED(req);
	return (NULL);
#endif
}